

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumeReliablePdu.cpp
# Opt level: O1

void __thiscall
DIS::StartResumeReliablePdu::unmarshal(StartResumeReliablePdu *this,DataStream *dataStream)

{
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  ClockTime::unmarshal(&this->_realWorldTime,dataStream);
  ClockTime::unmarshal(&this->_simulationTime,dataStream);
  DataStream::operator>>(dataStream,&this->_requiredReliabilityService);
  DataStream::operator>>(dataStream,&this->_pad1);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_requestID);
  return;
}

Assistant:

void StartResumeReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _realWorldTime.unmarshal(dataStream);
    _simulationTime.unmarshal(dataStream);
    dataStream >> _requiredReliabilityService;
    dataStream >> _pad1;
    dataStream >> _pad2;
    dataStream >> _requestID;
}